

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O1

void __thiscall
pbrt::BinaryReader::read<std::__cxx11::string,std::shared_ptr<pbrt::Texture>>
          (BinaryReader *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>_>_>
          *result)

{
  pointer puVar1;
  mapped_type *pmVar2;
  runtime_error *this_00;
  element_type *__nbytes;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *__buf;
  int iVar3;
  shared_ptr<pbrt::Texture> t2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> t1;
  shared_ptr<pbrt::Texture> local_68;
  key_type local_50;
  
  __nbytes = (element_type *)(this->currentEntityOffset + 4);
  puVar1 = (this->currentEntityData).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (__nbytes <=
      (element_type *)
      ((this->currentEntityData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_finish + -(long)puVar1)) {
    iVar3 = *(int *)(puVar1 + this->currentEntityOffset);
    this->currentEntityOffset = (size_t)__nbytes;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>_>_>
    ::clear(&result->_M_t);
    if (0 < iVar3) {
      __buf = extraout_RDX;
      do {
        local_50._M_string_length = 0;
        local_50.field_2._M_local_buf[0] = '\0';
        local_68.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_68.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        read(this,(int)&local_50,__buf,(size_t)__nbytes);
        read<pbrt::Texture>(this,&local_68);
        pmVar2 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>_>_>
                 ::operator[](result,&local_50);
        (pmVar2->super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             local_68.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        __nbytes = local_68.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(pmVar2->super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount,
                   &local_68.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        __buf = extraout_RDX_00;
        if (local_68.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_68.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
          __buf = extraout_RDX_01;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
          __buf = extraout_RDX_02;
        }
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"invalid read attempt by entity - not enough data in data block!");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void read(std::map<T1,T2> &result)
    {
      int32_t size;
      read(size);
      result.clear();
      for (int i=0;i<size;i++) {
        T1 t1; T2 t2;
        read(t1);
        read(t2);
        result[t1] = t2;
      }
    }